

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int execute_filter_rgb(rar_filter *filter,rar_virtual_machine *vm)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint8_t *puVar7;
  uint32_t delta3;
  uint32_t delta2;
  uint32_t delta1;
  uint8_t *prev;
  uint local_48;
  uint uStack_44;
  uint8_t byte;
  uint32_t j;
  uint32_t i;
  uint8_t *dst;
  uint8_t *src;
  uint32_t blocklength;
  uint32_t byteoffset;
  uint32_t stride;
  rar_virtual_machine *vm_local;
  rar_filter *filter_local;
  
  uVar1 = filter->initialregisters[0];
  uVar2 = filter->initialregisters[1];
  uVar3 = filter->initialregisters[4];
  if ((((uVar3 < 0x1e001) && (uVar1 <= uVar3)) && (2 < uVar3)) && (uVar2 < 3)) {
    dst = vm->memory;
    puVar7 = vm->memory + uVar3;
    for (uStack_44 = 0; uStack_44 < 3; uStack_44 = uStack_44 + 1) {
      prev._7_1_ = 0;
      _delta2 = puVar7 + ((ulong)uStack_44 - (ulong)uVar1);
      for (local_48 = uStack_44; local_48 < uVar3; local_48 = local_48 + 3) {
        if (puVar7 <= dst) {
          return 0;
        }
        if (puVar7 <= _delta2) {
          uVar4 = (uint)_delta2[3] - (uint)*_delta2;
          if ((int)uVar4 < 1) {
            uVar4 = -uVar4;
          }
          uVar5 = (uint)prev._7_1_ - (uint)*_delta2;
          if ((int)uVar5 < 1) {
            uVar5 = -uVar5;
          }
          uVar6 = (((uint)_delta2[3] - (uint)*_delta2) + (uint)prev._7_1_) - (uint)*_delta2;
          if ((int)uVar6 < 1) {
            uVar6 = -uVar6;
          }
          if ((uVar5 < uVar4) || (uVar6 < uVar4)) {
            if (uVar6 < uVar5) {
              prev._7_1_ = *_delta2;
            }
            else {
              prev._7_1_ = _delta2[3];
            }
          }
        }
        prev._7_1_ = prev._7_1_ - *dst;
        puVar7[local_48] = prev._7_1_;
        _delta2 = _delta2 + 3;
        dst = dst + 1;
      }
    }
    while (uStack_44 = uVar2, uStack_44 < uVar3 - 2) {
      puVar7[uStack_44] = puVar7[uStack_44] + puVar7[uStack_44 + 1];
      puVar7[uStack_44 + 2] = puVar7[uStack_44 + 2] + puVar7[uStack_44 + 1];
      uVar2 = uStack_44 + 3;
    }
    filter->filteredblockaddress = uVar3;
    filter->filteredblocklength = uVar3;
    filter_local._4_4_ = 1;
  }
  else {
    filter_local._4_4_ = 0;
  }
  return filter_local._4_4_;
}

Assistant:

static int
execute_filter_rgb(struct rar_filter *filter, struct rar_virtual_machine *vm)
{
  uint32_t stride = filter->initialregisters[0];
  uint32_t byteoffset = filter->initialregisters[1];
  uint32_t blocklength = filter->initialregisters[4];
  uint8_t *src, *dst;
  uint32_t i, j;

  if (blocklength > PROGRAM_WORK_SIZE / 2 || stride > blocklength || blocklength < 3 || byteoffset > 2)
    return 0;

  src = &vm->memory[0];
  dst = &vm->memory[blocklength];
  for (i = 0; i < 3; i++) {
    uint8_t byte = 0;
    uint8_t *prev = dst + i - stride;
    for (j = i; j < blocklength; j += 3)
    {
      /*
       * The src block should not overlap with the dst block.
       * If so it would be better to consider this archive is broken.
       */
      if (src >= dst)
        return 0;

      if (prev >= dst)
      {
        uint32_t delta1 = abs(prev[3] - prev[0]);
        uint32_t delta2 = abs(byte - prev[0]);
        uint32_t delta3 = abs(prev[3] - prev[0] + byte - prev[0]);
        if (delta1 > delta2 || delta1 > delta3)
          byte = delta2 <= delta3 ? prev[3] : prev[0];
      }
      byte -= *src++;
      dst[j] = byte;
      prev += 3;
    }
  }
  for (i = byteoffset; i < blocklength - 2; i += 3)
  {
    dst[i] += dst[i + 1];
    dst[i + 2] += dst[i + 1];
  }

  filter->filteredblockaddress = blocklength;
  filter->filteredblocklength = blocklength;

  return 1;
}